

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_reflect_deleteProperty(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSAtom JVar1;
  int iVar2;
  JSContext *in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  long in_R8;
  JSValue JVar3;
  int ret;
  JSAtom atom;
  JSValue obj;
  JSAtom in_stack_ffffffffffffff8c;
  JSAtom prop;
  long lVar4;
  JSValue in_stack_ffffffffffffffd0;
  undefined4 uStack_c;
  
  iVar2 = in_RSI.int32;
  prop = in_RSI._4_4_;
  if ((int)*(undefined8 *)(in_R8 + 8) == -1) {
    val.tag = (int64_t)in_RDX;
    val.u.float64 = in_RSI.float64;
    JVar1 = JS_ValueToAtom(in_RDI,val);
    if (JVar1 == 0) {
      JVar3.u.ptr = (void *)(in_stack_ffffffffffffffd0._4_8_ << 0x20);
      JVar3.tag = 6;
    }
    else {
      iVar2 = JS_DeleteProperty(in_RDX,in_stack_ffffffffffffffd0,prop,iVar2);
      lVar4 = in_stack_ffffffffffffffd0._4_8_;
      JS_FreeAtom((JSContext *)CONCAT44(JVar1,iVar2),in_stack_ffffffffffffff8c);
      if (iVar2 < 0) {
        JVar3.u.ptr = (void *)(lVar4 << 0x20);
        JVar3.tag = 6;
      }
      else {
        JVar3.u.int32._1_3_ = 0;
        JVar3.u.int32._0_1_ = iVar2 != 0;
        JVar3.u._4_4_ = uStack_c;
        JVar3.tag = 1;
      }
    }
  }
  else {
    JVar3 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x1bcc66);
  }
  return JVar3;
}

Assistant:

static JSValue js_reflect_deleteProperty(JSContext *ctx, JSValueConst this_val,
                                         int argc, JSValueConst *argv)
{
    JSValueConst obj;
    JSAtom atom;
    int ret;

    obj = argv[0];
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);
    atom = JS_ValueToAtom(ctx, argv[1]);
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    ret = JS_DeleteProperty(ctx, obj, atom, 0);
    JS_FreeAtom(ctx, atom);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}